

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O0

void __thiscall Debugger::DoLogMessage(Debugger *this,shared_ptr<BreakPoint> *bp)

{
  shared_ptr<EvalContext> *this_00;
  uint uVar1;
  size_t sVar2;
  bool bVar3;
  element_type *peVar4;
  string *psVar5;
  size_t sVar6;
  char *pcVar7;
  value_type *pvVar8;
  reference pvVar9;
  element_type *peVar10;
  Variable *pVVar11;
  ulong uVar12;
  EmmyFacade *this_01;
  undefined8 uVar13;
  undefined8 uVar14;
  string local_2e8 [32];
  undefined1 local_2c8 [8];
  string baseName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> fragment_1;
  undefined1 local_270 [7];
  bool succeed;
  shared_ptr<EvalContext> ctx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> fragment;
  value_type *replaceExpress;
  size_t index_1;
  size_t start;
  stringstream message;
  ostream local_218 [382];
  bool local_9a;
  bool local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  bool local_75 [20];
  char local_61;
  size_t sStack_60;
  char ch;
  size_t index;
  size_t exprLeftCount;
  size_t rightBraceBegin;
  size_t leftBraceBegin;
  vector<LogMessageReplaceExpress,_std::allocator<LogMessageReplaceExpress>_> replaceExpresses;
  ParseState state;
  string *logMessage;
  shared_ptr<BreakPoint> *bp_local;
  Debugger *this_local;
  
  peVar4 = std::__shared_ptr_access<BreakPoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<BreakPoint,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      bp);
  psVar5 = &peVar4->logMessage;
  replaceExpresses.
  super__Vector_base<LogMessageReplaceExpress,_std::allocator<LogMessageReplaceExpress>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::vector<LogMessageReplaceExpress,_std::allocator<LogMessageReplaceExpress>_>::vector
            ((vector<LogMessageReplaceExpress,_std::allocator<LogMessageReplaceExpress>_> *)
             &leftBraceBegin);
  rightBraceBegin = 0;
  exprLeftCount = 0;
  index = 0;
  for (sStack_60 = 0; sVar2 = sStack_60, sVar6 = std::__cxx11::string::size(), sVar2 != sVar6;
      sStack_60 = sStack_60 + 1) {
    pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)psVar5);
    local_61 = *pcVar7;
    if (replaceExpresses.
        super__Vector_base<LogMessageReplaceExpress,_std::allocator<LogMessageReplaceExpress>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
      if (local_61 == '{') {
        replaceExpresses.
        super__Vector_base<LogMessageReplaceExpress,_std::allocator<LogMessageReplaceExpress>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
        rightBraceBegin = sStack_60;
        index = 0;
      }
      else if (local_61 == '}') {
        replaceExpresses.
        super__Vector_base<LogMessageReplaceExpress,_std::allocator<LogMessageReplaceExpress>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 2;
        exprLeftCount = sStack_60;
      }
    }
    else if (replaceExpresses.
             super__Vector_base<LogMessageReplaceExpress,_std::allocator<LogMessageReplaceExpress>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 1) {
      if (local_61 == '{') {
        if (sStack_60 == rightBraceBegin + 1) {
          local_75[0] = false;
          std::vector<LogMessageReplaceExpress,std::allocator<LogMessageReplaceExpress>>::
          emplace_back<char_const(&)[2],unsigned_long&,unsigned_long&,bool>
                    ((vector<LogMessageReplaceExpress,std::allocator<LogMessageReplaceExpress>> *)
                     &leftBraceBegin,(char (*) [2])"{",&rightBraceBegin,&stack0xffffffffffffffa0,
                     local_75);
          replaceExpresses.
          super__Vector_base<LogMessageReplaceExpress,_std::allocator<LogMessageReplaceExpress>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        }
        else {
          index = index + 1;
        }
      }
      else if (local_61 == '}') {
        if (index == 0) {
          std::__cxx11::string::substr((ulong)&local_98,(ulong)psVar5);
          local_99 = true;
          std::vector<LogMessageReplaceExpress,std::allocator<LogMessageReplaceExpress>>::
          emplace_back<std::__cxx11::string,unsigned_long&,unsigned_long&,bool>
                    ((vector<LogMessageReplaceExpress,std::allocator<LogMessageReplaceExpress>> *)
                     &leftBraceBegin,&local_98,&rightBraceBegin,&stack0xffffffffffffffa0,&local_99);
          std::__cxx11::string::~string((string *)&local_98);
          replaceExpresses.
          super__Vector_base<LogMessageReplaceExpress,_std::allocator<LogMessageReplaceExpress>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        }
        else {
          index = index - 1;
        }
      }
    }
    else if (replaceExpresses.
             super__Vector_base<LogMessageReplaceExpress,_std::allocator<LogMessageReplaceExpress>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 2) {
      if ((local_61 == '}') && (sStack_60 == exprLeftCount + 1)) {
        local_9a = false;
        std::vector<LogMessageReplaceExpress,std::allocator<LogMessageReplaceExpress>>::
        emplace_back<char_const(&)[2],unsigned_long&,unsigned_long&,bool>
                  ((vector<LogMessageReplaceExpress,std::allocator<LogMessageReplaceExpress>> *)
                   &leftBraceBegin,(char (*) [2])0x22f543,&exprLeftCount,&stack0xffffffffffffffa0,
                   &local_9a);
      }
      else {
        sStack_60 = sStack_60 - 1;
      }
      replaceExpresses.
      super__Vector_base<LogMessageReplaceExpress,_std::allocator<LogMessageReplaceExpress>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    }
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&start);
  bVar3 = std::vector<LogMessageReplaceExpress,_std::allocator<LogMessageReplaceExpress>_>::empty
                    ((vector<LogMessageReplaceExpress,_std::allocator<LogMessageReplaceExpress>_> *)
                     &leftBraceBegin);
  if (bVar3) {
    std::operator<<(local_218,(string *)psVar5);
  }
  else {
    index_1 = 0;
    for (replaceExpress = (value_type *)0x0;
        pvVar8 = (value_type *)
                 std::vector<LogMessageReplaceExpress,_std::allocator<LogMessageReplaceExpress>_>::
                 size((vector<LogMessageReplaceExpress,_std::allocator<LogMessageReplaceExpress>_> *
                      )&leftBraceBegin), replaceExpress != pvVar8;
        replaceExpress = (value_type *)&(replaceExpress->Expr).field_0x1) {
      pvVar9 = std::vector<LogMessageReplaceExpress,_std::allocator<LogMessageReplaceExpress>_>::
               operator[]((vector<LogMessageReplaceExpress,_std::allocator<LogMessageReplaceExpress>_>
                           *)&leftBraceBegin,(size_type)replaceExpress);
      if (index_1 < pvVar9->StartIndex) {
        std::__cxx11::string::substr
                  ((ulong)&ctx.super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount,(ulong)psVar5);
        std::operator<<(local_218,
                        (string *)
                        &ctx.super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       );
        std::__cxx11::string::~string
                  ((string *)
                   &ctx.super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
      if ((pvVar9->NeedEval & 1U) == 0) {
        std::operator<<(local_218,(string *)pvVar9);
      }
      else {
        std::make_shared<EvalContext>();
        peVar10 = std::__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_270);
        std::__cxx11::string::operator=((string *)&peVar10->expr,(string *)pvVar9);
        peVar10 = std::__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_270);
        peVar10->depth = 1;
        this_00 = (shared_ptr<EvalContext> *)((long)&fragment_1.field_2 + 8);
        std::shared_ptr<EvalContext>::shared_ptr(this_00,(shared_ptr<EvalContext> *)local_270);
        bVar3 = DoEval(this,this_00);
        std::shared_ptr<EvalContext>::~shared_ptr
                  ((shared_ptr<EvalContext> *)((long)&fragment_1.field_2 + 8));
        if (bVar3) {
          peVar10 = std::__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_270);
          pVVar11 = Idx<Variable>::operator->(&peVar10->result);
          std::operator<<(local_218,(string *)&pVVar11->value);
        }
        else {
          peVar10 = std::__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_270);
          std::operator<<(local_218,(string *)&peVar10->error);
        }
        std::shared_ptr<EvalContext>::~shared_ptr((shared_ptr<EvalContext> *)local_270);
      }
      index_1 = pvVar9->EndIndex + 1;
    }
    uVar12 = std::__cxx11::string::size();
    if (index_1 < uVar12) {
      std::__cxx11::string::size();
      std::__cxx11::string::substr((ulong)((long)&baseName.field_2 + 8),(ulong)psVar5);
      std::operator<<(local_218,(string *)(baseName.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(baseName.field_2._M_local_buf + 8));
    }
  }
  peVar4 = std::__shared_ptr_access<BreakPoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<BreakPoint,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      bp);
  BaseName((string *)local_2c8,&peVar4->file);
  this_01 = EmmyFacade::Get();
  uVar13 = std::__cxx11::string::c_str();
  peVar4 = std::__shared_ptr_access<BreakPoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<BreakPoint,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      bp);
  uVar1 = peVar4->line;
  std::__cxx11::stringstream::str();
  uVar14 = std::__cxx11::string::c_str();
  EmmyFacade::SendLog(this_01,Info,"[%s:%d] %s",uVar13,(ulong)uVar1,uVar14);
  std::__cxx11::string::~string(local_2e8);
  std::__cxx11::string::~string((string *)local_2c8);
  std::__cxx11::stringstream::~stringstream((stringstream *)&start);
  std::vector<LogMessageReplaceExpress,_std::allocator<LogMessageReplaceExpress>_>::~vector
            ((vector<LogMessageReplaceExpress,_std::allocator<LogMessageReplaceExpress>_> *)
             &leftBraceBegin);
  return;
}

Assistant:

void Debugger::DoLogMessage(std::shared_ptr<BreakPoint> bp) {
	std::string &logMessage = bp->logMessage;
	// 为什么不用regex?
	// 因为gcc 4.8 regex还是空实现
	// 而且后续版本的gcc中正则表达式行为似乎也不太正常
	enum class ParseState {
		Normal,
		LeftBrace,
		RightBrace
	} state = ParseState::Normal;

	std::vector<LogMessageReplaceExpress> replaceExpresses;


	std::size_t leftBraceBegin = 0;

	std::size_t rightBraceBegin = 0;

	// 如果在表达式中出现左大括号
	std::size_t exprLeftCount = 0;


	for (std::size_t index = 0; index != logMessage.size(); index++) {
		char ch = logMessage[index];

		switch (state) {
			case ParseState::Normal: {
				if (ch == '{') {
					state = ParseState::LeftBrace;
					leftBraceBegin = index;
					exprLeftCount = 0;
				} else if (ch == '}') {
					state = ParseState::RightBrace;
					rightBraceBegin = index;
				}
				break;
			}
			case ParseState::LeftBrace: {
				if (ch == '{') {
					// 认为是左双大括号转义为可见的'{'
					if (index == leftBraceBegin + 1) {
						replaceExpresses.emplace_back("{", leftBraceBegin, index, false);
						state = ParseState::Normal;
					} else {
						exprLeftCount++;
					}
				} else if (ch == '}') {
					// 认为是表达式内的大括号
					if (exprLeftCount > 0) {
						exprLeftCount--;
						continue;
					}

					replaceExpresses.emplace_back(logMessage.substr(leftBraceBegin + 1, index - leftBraceBegin - 1),
					                              leftBraceBegin, index, true);


					state = ParseState::Normal;
				}
				break;
			}
			case ParseState::RightBrace: {
				if (ch == '}' && (index == rightBraceBegin + 1)) {
					replaceExpresses.emplace_back("}", rightBraceBegin, index, false);
				} else {
					//认为左右大括号失配，之前的不做处理，退格一位回去重新判断
					index--;
				}
				state = ParseState::Normal;
				break;
			}
		}
	}

	std::stringstream message;

	if (replaceExpresses.empty()) {
		message << logMessage;
	} else {
		// 拼接字符串
		// 怎么replace 函数都没有啊

		std::size_t start = 0;
		for (std::size_t index = 0; index != replaceExpresses.size(); index++) {
			auto &replaceExpress = replaceExpresses[index];
			if (start < replaceExpress.StartIndex) {
				auto fragment = logMessage.substr(start, replaceExpress.StartIndex - start);
				message << fragment;
				start = replaceExpress.StartIndex;
			}

			if (replaceExpress.NeedEval) {
				auto ctx = std::make_shared<EvalContext>();
				ctx->expr = std::move(replaceExpress.Expr);
				ctx->depth = 1;
				bool succeed = DoEval(ctx);
				if (succeed) {
					message << ctx->result->value;
				} else {
					message << ctx->error;
				}
			} else {
				message << replaceExpress.Expr;
			}

			start = replaceExpress.EndIndex + 1;
		}

		if (start < logMessage.size()) {
			auto fragment = logMessage.substr(start, logMessage.size() - start);
			message << fragment;
		}
	}

	std::string baseName = BaseName(bp->file);

	EmmyFacade::Get().SendLog(LogType::Info, "[%s:%d] %s", baseName.c_str(), bp->line, message.str().c_str());
}